

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

IPAsKeyLRU * __thiscall IPAsKeyLRU::CreateCopy(IPAsKeyLRU *this)

{
  IPAsKeyLRU *this_00;
  IPAsKeyLRU *x;
  IPAsKeyLRU *this_local;
  
  this_00 = (IPAsKeyLRU *)operator_new(0x48);
  IPAsKeyLRU(this_00,(this->super_IPAsKey).addr,(this->super_IPAsKey).addr_len);
  if (this_00 != (IPAsKeyLRU *)0x0) {
    (this_00->super_IPAsKey).count = (this->super_IPAsKey).count;
    (this_00->super_IPAsKey).hash = (this->super_IPAsKey).hash;
  }
  return this_00;
}

Assistant:

IPAsKeyLRU * IPAsKeyLRU::CreateCopy()
{
    IPAsKeyLRU * x = new IPAsKeyLRU(addr, addr_len);

    if (x != NULL)
    {
        x->count = count;
        x->hash = hash;
    }

    return x;
}